

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O1

void object_short_name(char *buf,size_t max,char *name)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  sVar1 = strlen(name);
  if (max == 1 || sVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
    do {
      if (uVar3 == 0) {
        if (*name == '&') {
          uVar3 = (ulong)((uint)(name[1] == ' ') * 2);
        }
        else {
          uVar3 = 0;
        }
      }
      if (name[uVar3] != '~') {
        buf[uVar2] = name[uVar3];
        uVar2 = uVar2 + 1;
      }
      uVar3 = uVar3 + 1;
    } while ((uVar3 < sVar1) && (uVar2 < max - 1));
  }
  buf[uVar2] = '\0';
  return;
}

Assistant:

void object_short_name(char *buf, size_t max, const char *name)
{
	size_t j, k;
	/* Copy across the name, stripping modifiers & and ~) */
	size_t len = strlen(name);
	for (j = 0, k = 0; j < len && k < max - 1; j++) {
		if (j == 0 && name[0] == '&' && name[1] == ' ')
			j += 2;
		if (name[j] == '~')
			continue;

		buf[k++] = name[j];
	}
	buf[k] = 0;
}